

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O3

timestamp_ns_t duckdb::Timestamp::TimestampNsFromEpochMillis(int64_t millis)

{
  bool bVar1;
  ConversionException *this;
  timestamp_ns_t result;
  timestamp_t local_48;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(millis,1000,&local_48.value);
  if (bVar1) {
    return (timestamp_ns_t)(timestamp_t)local_48.value;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not convert Timestamp(US) to Timestamp(NS)","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

timestamp_ns_t Timestamp::TimestampNsFromEpochMillis(int64_t millis) {
	D_ASSERT(Timestamp::IsFinite(timestamp_t(millis)));
	timestamp_ns_t result;
	if (!TryMultiplyOperator::Operation(millis, Interval::NANOS_PER_MICRO, result.value)) {
		throw ConversionException("Could not convert Timestamp(US) to Timestamp(NS)");
	}
	return result;
}